

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::makeVLV(MidiFile *this,uchar *buffer,int number)

{
  bool bVar1;
  ulong uVar2;
  ostream *this_00;
  int local_3c;
  int length;
  int flag;
  int i;
  unsigned_long value;
  int number_local;
  uchar *buffer_local;
  MidiFile *this_local;
  
  uVar2 = (ulong)number;
  if (uVar2 < 0x10000000) {
    *buffer = (byte)(uVar2 >> 0x15) & 0x7f;
    buffer[1] = (byte)(uVar2 >> 0xe) & 0x7f;
    buffer[2] = (byte)(uVar2 >> 7) & 0x7f;
    buffer[3] = (byte)number & 0x7f;
    bVar1 = false;
    local_3c = -1;
    for (length = 0; length < 3; length = length + 1) {
      if (buffer[length] != '\0') {
        bVar1 = true;
      }
      if (bVar1) {
        buffer[length] = buffer[length] | 0x80;
      }
      if ((local_3c == -1) && (0x7f < buffer[length])) {
        local_3c = 4 - length;
      }
    }
    if (local_3c == -1) {
      local_3c = 1;
    }
    if (local_3c < 4) {
      for (length = 0; length < local_3c; length = length + 1) {
        buffer[length] = buffer[(4 - local_3c) + length];
      }
    }
    this_local._4_4_ = local_3c;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error: Meta-message size too large to handle");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    *buffer = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int MidiFile::makeVLV(uchar *buffer, int number) {

	unsigned long value = (unsigned long)number;

	if (value >= (1 << 28)) {
		std::cerr << "Error: Meta-message size too large to handle" << std::endl;
		buffer[0] = 0;
		buffer[1] = 0;
		buffer[2] = 0;
		buffer[3] = 0;
		return 1;
	}

	buffer[0] = (value >> 21) & 0x7f;
	buffer[1] = (value >> 14) & 0x7f;
	buffer[2] = (value >>  7) & 0x7f;
	buffer[3] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	int length = -1;
	for (i=0; i<3; i++) {
		if (buffer[i] != 0) {
			flag = 1;
		}
		if (flag) {
			buffer[i] |= 0x80;
		}
		if (length == -1 && buffer[i] >= 0x80) {
			length = 4-i;
		}
	}

	if (length == -1) {
		length = 1;
	}

	if (length < 4) {
		for (i=0; i<length; i++) {
			buffer[i] = buffer[4-length+i];
		}
	}

	return length;
}